

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O3

SASL_INIT_HANDLE sasl_init_create(char *mechanism_value)

{
  int iVar1;
  SASL_INIT_HANDLE __ptr;
  AMQP_VALUE value;
  AMQP_VALUE item_value;
  SASL_INIT_INSTANCE *sasl_init_instance;
  
  __ptr = (SASL_INIT_HANDLE)malloc(8);
  if (__ptr != (SASL_INIT_HANDLE)0x0) {
    value = amqpvalue_create_composite_with_ulong_descriptor(0x41);
    __ptr->composite_value = value;
    if (value != (AMQP_VALUE)0x0) {
      item_value = amqpvalue_create_symbol(mechanism_value);
      iVar1 = amqpvalue_set_composite_item(value,0,item_value);
      amqpvalue_destroy(item_value);
      if (iVar1 == 0) {
        return __ptr;
      }
      amqpvalue_destroy(value);
    }
    free(__ptr);
  }
  return (SASL_INIT_HANDLE)0x0;
}

Assistant:

SASL_INIT_HANDLE sasl_init_create(const char* mechanism_value)
{
    SASL_INIT_INSTANCE* sasl_init_instance = (SASL_INIT_INSTANCE*)malloc(sizeof(SASL_INIT_INSTANCE));
    if (sasl_init_instance != NULL)
    {
        sasl_init_instance->composite_value = amqpvalue_create_composite_with_ulong_descriptor(65);
        if (sasl_init_instance->composite_value == NULL)
        {
            free(sasl_init_instance);
            sasl_init_instance = NULL;
        }
        else
        {
            AMQP_VALUE mechanism_amqp_value;
            int result = 0;

            mechanism_amqp_value = amqpvalue_create_symbol(mechanism_value);
            if ((result == 0) && (amqpvalue_set_composite_item(sasl_init_instance->composite_value, 0, mechanism_amqp_value) != 0))
            {
                result = MU_FAILURE;
            }

            amqpvalue_destroy(mechanism_amqp_value);
            if (result != 0)
            {
                sasl_init_destroy(sasl_init_instance);
                sasl_init_instance = NULL;
            }
        }
    }

    return sasl_init_instance;
}